

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

wchar_t initialize_summary(player *p,equippable_summary **s)

{
  loc_conflict grid;
  loc_conflict grid_00;
  wchar_t wVar1;
  equippable_summary *peVar2;
  ui_entry_iterator *i_00;
  ui_entry **ppuVar3;
  wchar_t **ppwVar4;
  wchar_t *pwVar5;
  ui_entry *entry_00;
  equippable_expr *peVar6;
  equippable_arranger *peVar7;
  object *poVar8;
  store *psVar9;
  equippable *peVar10;
  int *piVar11;
  wchar_t local_b4;
  ui_entry *entry;
  wchar_t j;
  wchar_t n;
  ui_entry_iterator *ui_iter;
  char *test_categories [2];
  char *categories [5];
  wchar_t i;
  wchar_t count;
  add_obj_to_summary_closure add_obj_data;
  obj_visitor_data visitor;
  equippable_summary **s_local;
  player *p_local;
  
  if (*s == (equippable_summary *)0x0) {
    memcpy(test_categories + 1,&DAT_002f3d60,0x28);
    peVar2 = (equippable_summary *)mem_alloc(0x200);
    *s = peVar2;
    (*s)->items = (equippable *)0x0;
    (*s)->sorted_indices = (int *)0x0;
    (*s)->p_and_eq_vals = (int *)0x0;
    (*s)->p_and_eq_auxvals = (int *)0x0;
    (*s)->dlg_trans_msg = (char *)0x0;
    (*s)->nitems = L'\0';
    (*s)->nalloc = L'\0';
    (*s)->stores = EQUIPPABLE_NO_STORE;
    (*s)->ifirst = L'\0';
    (*s)->indinc = L'\x01';
    (*s)->iview = L'\0';
    (*s)->npage = L'\0';
    (*s)->nshortnm = L'\0';
    (*s)->term_ncol = L'\xffffffff';
    (*s)->term_nrow = L'\xffffffff';
    (*s)->nproplab = L'\x02';
    (*s)->irow_combined_equip = (*s)->nproplab + L'\x01';
    (*s)->icol_name = L'\x04';
    (*s)->nprop = L'\0';
    ui_iter = (ui_entry_iterator *)anon_var_dwarf_111cc6;
    for (categories[4]._0_4_ = 0; (wchar_t)categories[4] < 5;
        categories[4]._0_4_ = (wchar_t)categories[4] + 1) {
      test_categories[0] = test_categories[(long)(wchar_t)categories[4] + 1];
      i_00 = initialize_ui_entry_iterator(check_for_two_categories,&ui_iter,test_categories[0]);
      wVar1 = count_ui_entry_iterator(i_00);
      (*s)->nprop = wVar1 + (*s)->nprop;
      (*s)->propcats[(wchar_t)categories[4]].n = wVar1;
      if ((wchar_t)categories[4] == 0) {
        local_b4 = L'\0';
      }
      else {
        local_b4 = (*s)->propcats[(wchar_t)categories[4] + -1].off +
                   (*s)->propcats[(wchar_t)categories[4] + -1].n;
      }
      (*s)->propcats[(wchar_t)categories[4]].off = local_b4;
      ppuVar3 = (ui_entry **)mem_alloc((long)wVar1 << 3);
      (*s)->propcats[(wchar_t)categories[4]].entries = ppuVar3;
      ppwVar4 = (wchar_t **)mem_alloc((long)wVar1 << 3);
      (*s)->propcats[(wchar_t)categories[4]].labels = ppwVar4;
      pwVar5 = (wchar_t *)mem_alloc((long)(wVar1 * ((*s)->nproplab + L'\x01')) << 2);
      (*s)->propcats[(wchar_t)categories[4]].label_buffer = pwVar5;
      for (entry._0_4_ = L'\0'; (wchar_t)entry < wVar1; entry._0_4_ = (wchar_t)entry + L'\x01') {
        entry_00 = advance_ui_entry_iterator(i_00);
        (*s)->propcats[(wchar_t)categories[4]].entries[(wchar_t)entry] = entry_00;
        (*s)->propcats[(wchar_t)categories[4]].labels[(wchar_t)entry] =
             (*s)->propcats[(wchar_t)categories[4]].label_buffer +
             (wchar_t)entry * ((*s)->nproplab + L'\x01');
        get_ui_entry_label(entry_00,(*s)->nproplab + L'\x01',true,
                           (*s)->propcats[(wchar_t)categories[4]].labels[(wchar_t)entry]);
      }
      release_ui_entry_iterator(i_00);
    }
    ((*s)->easy_filt).nalloc = L'\x05';
    peVar6 = (equippable_expr *)mem_alloc((long)((*s)->easy_filt).nalloc * 0x18);
    ((*s)->easy_filt).v = peVar6;
    switch((*s)->stores) {
    case EQUIPPABLE_NO_STORE:
      ((*s)->easy_filt).simple = EQUIP_EXPR_AND;
      ((*s)->easy_filt).nv = L'\x01';
      ((((*s)->easy_filt).v)->s).func = sel_exclude_src;
      ((((*s)->easy_filt).v)->s).ex.src = EQUIP_SOURCE_STORE;
      (((*s)->easy_filt).v)->c = EQUIP_EXPR_SELECTOR;
      break;
    case EQUIPPABLE_ONLY_STORE:
      ((*s)->easy_filt).simple = EQUIP_EXPR_AND;
      ((*s)->easy_filt).nv = L'\x01';
      ((((*s)->easy_filt).v)->s).func = sel_only_src;
      ((((*s)->easy_filt).v)->s).ex.src = EQUIP_SOURCE_STORE;
      (((*s)->easy_filt).v)->c = EQUIP_EXPR_SELECTOR;
      break;
    case EQUIPPABLE_YES_STORE:
      ((*s)->easy_filt).simple = EQUIP_EXPR_TERMINATOR;
      ((*s)->easy_filt).nv = L'\0';
      break;
    case EQUIPPABLE_ONLY_CARRIED:
      ((*s)->easy_filt).simple = EQUIP_EXPR_AND;
      ((*s)->easy_filt).nv = L'\x03';
      ((((*s)->easy_filt).v)->s).func = sel_exclude_src;
      ((((*s)->easy_filt).v)->s).ex.src = EQUIP_SOURCE_STORE;
      (((*s)->easy_filt).v)->c = EQUIP_EXPR_SELECTOR;
      ((*s)->easy_filt).v[1].s.func = sel_exclude_src;
      ((*s)->easy_filt).v[1].s.ex.src = EQUIP_SOURCE_HOME;
      ((*s)->easy_filt).v[1].c = EQUIP_EXPR_SELECTOR;
      ((*s)->easy_filt).v[2].s.func = sel_exclude_src;
      ((*s)->easy_filt).v[2].s.ex.src = EQUIP_SOURCE_FLOOR;
      ((*s)->easy_filt).v[2].c = EQUIP_EXPR_SELECTOR;
    }
    for (categories[4]._0_4_ = ((*s)->easy_filt).nv;
        (wchar_t)categories[4] < ((*s)->easy_filt).nalloc;
        categories[4]._0_4_ = (wchar_t)categories[4] + L'\x01') {
      ((*s)->easy_filt).v[(wchar_t)categories[4]].c = EQUIP_EXPR_TERMINATOR;
    }
    ((*s)->config_filt).v = (equippable_expr *)0x0;
    ((*s)->config_filt).simple = EQUIP_EXPR_TERMINATOR;
    ((*s)->config_filt).nv = L'\0';
    ((*s)->config_filt).nalloc = L'\0';
    ((*s)->config_mod_filt).v = (equippable_expr *)0x0;
    ((*s)->config_mod_filt).simple = EQUIP_EXPR_TERMINATOR;
    ((*s)->config_mod_filt).nv = L'\0';
    ((*s)->config_mod_filt).nalloc = L'\0';
    (*s)->config_filt_is_on = false;
    ((*s)->default_sort).nalloc = L'\x05';
    peVar7 = (equippable_arranger *)mem_alloc((long)((*s)->default_sort).nalloc << 4);
    ((*s)->default_sort).v = peVar7;
    (((*s)->default_sort).v)->func = cmp_by_slot;
    (((*s)->default_sort).v)->propind = L'\0';
    ((*s)->default_sort).v[1].func = cmp_by_location;
    ((*s)->default_sort).v[1].propind = L'\0';
    ((*s)->default_sort).v[2].func = cmp_by_quality;
    ((*s)->default_sort).v[2].propind = L'\0';
    ((*s)->default_sort).v[3].func = cmp_by_short_name;
    ((*s)->default_sort).v[3].propind = L'\0';
    ((*s)->default_sort).v[4].func = (equippable_cmpfunc)0x0;
    ((*s)->default_sort).v[4].propind = L'\0';
    ((*s)->default_sort).nv = L'\x04';
    ((*s)->config_sort).v = (equippable_arranger *)0x0;
    ((*s)->config_sort).nv = L'\0';
    ((*s)->config_sort).nalloc = L'\0';
    (*s)->config_sort_is_on = false;
  }
  wVar1 = reconfigure_for_term_if_necessary(false,p,*s);
  if (wVar1 == L'\0') {
    add_obj_data._16_8_ = select_any;
    apply_visitor_to_equipped(p,(obj_visitor_data *)&add_obj_data.src);
    add_obj_data._16_8_ = select_nonequipped_wearable;
    apply_visitor_to_pile(p->gear,(obj_visitor_data *)&add_obj_data.src);
    if (cave != (chunk_conflict *)0x0) {
      add_obj_data._16_8_ = select_seen_wearable;
      grid.x = (p->grid).x;
      grid.y = (p->grid).y;
      poVar8 = square_object((chunk *)cave,grid);
      apply_visitor_to_pile(poVar8,(obj_visitor_data *)&add_obj_data.src);
    }
    add_obj_data._16_8_ = select_wearable;
    psVar9 = store_home(p);
    if (psVar9 != (store *)0x0) {
      psVar9 = store_home(p);
      apply_visitor_to_pile(psVar9->stock,(obj_visitor_data *)&add_obj_data.src);
    }
    if ((*s)->nalloc < L'\0') {
      mem_free((*s)->sorted_indices);
      cleanup_summary_items(*s);
      mem_free((*s)->items);
      peVar10 = (equippable *)mem_zalloc(0);
      (*s)->items = peVar10;
      piVar11 = (int *)mem_alloc(4);
      (*s)->sorted_indices = piVar11;
      (*s)->nalloc = L'\0';
    }
    (*s)->nitems = L'\0';
    add_obj_data.p = (player *)*s;
    add_obj_data.summary._0_4_ = 0;
    add_obj_data._16_8_ = select_any;
    apply_visitor_to_equipped(p,(obj_visitor_data *)&add_obj_data.src);
    add_obj_data.summary._0_4_ = 1;
    add_obj_data._16_8_ = select_nonequipped_wearable;
    apply_visitor_to_pile(p->gear,(obj_visitor_data *)&add_obj_data.src);
    if (cave != (chunk_conflict *)0x0) {
      add_obj_data.summary._0_4_ = 2;
      add_obj_data._16_8_ = select_seen_wearable;
      grid_00.x = (p->grid).x;
      grid_00.y = (p->grid).y;
      poVar8 = square_object((chunk *)cave,grid_00);
      apply_visitor_to_pile(poVar8,(obj_visitor_data *)&add_obj_data.src);
    }
    add_obj_data.summary._0_4_ = 3;
    add_obj_data._16_8_ = select_wearable;
    psVar9 = store_home(p);
    if (psVar9 != (store *)0x0) {
      psVar9 = store_home(p);
      apply_visitor_to_pile(psVar9->stock,(obj_visitor_data *)&add_obj_data.src);
    }
    compute_player_and_equipment_values(p,*s);
    filter_items(*s);
    sort_items(*s);
    (*s)->isel0 = L'\xffffffff';
    (*s)->isel1 = L'\xffffffff';
    (*s)->work_sel = L'\xffffffff';
    p_local._4_4_ = L'\0';
  }
  else {
    p_local._4_4_ = L'\x01';
  }
  return p_local._4_4_;
}

Assistant:

static int initialize_summary(struct player *p,
	struct equippable_summary **s)
{
	struct obj_visitor_data visitor;
	struct add_obj_to_summary_closure add_obj_data;
	int count, i;

	if (*s == NULL) {
		const char *categories[] = {
			"resistances",
			"abilities",
			"hindrances",
			"modifiers",
			"stat_modifiers"
		};
		const char *test_categories[2];

		*s = mem_alloc(sizeof(**s));
		(*s)->items = NULL;
		(*s)->sorted_indices = NULL;
		(*s)->p_and_eq_vals = NULL;
		(*s)->p_and_eq_auxvals = NULL;
		(*s)->dlg_trans_msg = NULL;
		(*s)->nitems = 0;
		(*s)->nalloc = 0;
		(*s)->stores = EQUIPPABLE_NO_STORE;
		(*s)->ifirst = 0;
		(*s)->indinc = 1;
		(*s)->iview = 0;
		(*s)->npage = 0;
		(*s)->nshortnm = 0;
		(*s)->term_ncol = -1;
		(*s)->term_nrow = -1;

		/* These are currently hardwired layout choices. */
		(*s)->nproplab = 2;
		(*s)->irow_combined_equip = (*s)->nproplab + 1;
		/*
		 * Leave room for a character (item character), a space,
		 * a character (item location code), and a space.
		 */
		(*s)->icol_name = 4;

		/*
		 * These need to be done once after the game configuration is
		 * read.
		 */
		(*s)->nprop = 0;
		test_categories[0] = "EQUIPCMP_SCREEN";
		for (i = 0; i < (int)N_ELEMENTS((*s)->propcats); ++i) {
			struct ui_entry_iterator *ui_iter;
			int n, j;

			test_categories[1] = categories[i];
			ui_iter = initialize_ui_entry_iterator(
				check_for_two_categories, test_categories,
				test_categories[1]);
			n = count_ui_entry_iterator(ui_iter);
			(*s)->nprop += n;
			(*s)->propcats[i].n = n;
			(*s)->propcats[i].off = (i == 0) ?
				0 : (*s)->propcats[i - 1].off +
				(*s)->propcats[i - 1].n;
			(*s)->propcats[i].entries = mem_alloc(n *
				sizeof(*(*s)->propcats[i].entries));
			(*s)->propcats[i].labels = mem_alloc(n *
				sizeof(*(*s)->propcats[i].labels));
			(*s)->propcats[i].label_buffer = mem_alloc(n *
				((*s)->nproplab + 1) *
				sizeof(*(*s)->propcats[i].label_buffer));
			for (j = 0; j < n; ++j) {
				struct ui_entry *entry =
					advance_ui_entry_iterator(ui_iter);

				(*s)->propcats[i].entries[j] = entry;
				(*s)->propcats[i].labels[j] =
					(*s)->propcats[i].label_buffer +
					j * ((*s)->nproplab + 1);
				get_ui_entry_label(entry,
					(*s)->nproplab + 1, true,
					(*s)->propcats[i].labels[j]);
			}
			release_ui_entry_iterator(ui_iter);
		}

		/*
		 * Start with nothing for the easy filter but set up space
		 * so it is trivial to add one term filtering on an attribute
		 * and up to three others that can filter on the source of the
		 * item.
		 */
		(*s)->easy_filt.nalloc = 5;
		(*s)->easy_filt.v = mem_alloc((*s)->easy_filt.nalloc *
			sizeof(*(*s)->easy_filt.v));
		switch ((*s)->stores) {
		case EQUIPPABLE_NO_STORE:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 1;
			(*s)->easy_filt.v[0].s.func = sel_exclude_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			break;

		case EQUIPPABLE_ONLY_STORE:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 1;
			(*s)->easy_filt.v[0].s.func = sel_only_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			break;

		case EQUIPPABLE_YES_STORE:
			/* There's no filtering to be done. */
			(*s)->easy_filt.simple = EQUIP_EXPR_TERMINATOR;
			(*s)->easy_filt.nv = 0;
			break;

		case EQUIPPABLE_ONLY_CARRIED:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 3;
			(*s)->easy_filt.v[0].s.func = sel_exclude_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			(*s)->easy_filt.v[1].s.func = sel_exclude_src;
			(*s)->easy_filt.v[1].s.ex.src = EQUIP_SOURCE_HOME;
			(*s)->easy_filt.v[1].c = EQUIP_EXPR_SELECTOR;
			(*s)->easy_filt.v[2].s.func = sel_exclude_src;
			(*s)->easy_filt.v[2].s.ex.src = EQUIP_SOURCE_FLOOR;
			(*s)->easy_filt.v[2].c = EQUIP_EXPR_SELECTOR;
		}

		for (i = (*s)->easy_filt.nv; i < (*s)->easy_filt.nalloc; ++i) {
			(*s)->easy_filt.v[i].c = EQUIP_EXPR_TERMINATOR;
		}

		/* Start with nothing for the specially configured filter. */
		(*s)->config_filt.v = NULL;
		(*s)->config_filt.simple = EQUIP_EXPR_TERMINATOR;
		(*s)->config_filt.nv = 0;
		(*s)->config_filt.nalloc = 0;
		(*s)->config_mod_filt.v = NULL;
		(*s)->config_mod_filt.simple = EQUIP_EXPR_TERMINATOR;
		(*s)->config_mod_filt.nv = 0;
		(*s)->config_mod_filt.nalloc = 0;
		(*s)->config_filt_is_on = false;

		/*
		 * The default sort is by equipment slot.  Any ties are
		 * resolved first by the location of the object, rough object
		 * quality, and then alphabetical order.
		 */
		(*s)->default_sort.nalloc = 5;
		(*s)->default_sort.v = mem_alloc((*s)->default_sort.nalloc *
			sizeof(*(*s)->default_sort.v));
		(*s)->default_sort.v[0].func = cmp_by_slot;
		(*s)->default_sort.v[0].propind = 0;
		(*s)->default_sort.v[1].func = cmp_by_location;
		(*s)->default_sort.v[1].propind = 0;
		(*s)->default_sort.v[2].func = cmp_by_quality;
		(*s)->default_sort.v[2].propind = 0;
		(*s)->default_sort.v[3].func = cmp_by_short_name;
		(*s)->default_sort.v[3].propind = 0;
		(*s)->default_sort.v[4].func = 0;
		(*s)->default_sort.v[4].propind = 0;
		(*s)->default_sort.nv = 4;

		/* Start with nothing for the specially configured sort. */
		(*s)->config_sort.v = NULL;
		(*s)->config_sort.nv = 0;
		(*s)->config_sort.nalloc = 0;
		(*s)->config_sort_is_on = false;
	}

	/* These need to be redone on a change to the terminal size. */
	if (reconfigure_for_term_if_necessary(false, p, *s)) {
		return 1;
	}

	/*
	 * These need to be redone for any change in the equipped items, pack,
	 * home, or stores.
	 */

	/* Count the available items to include. */
	count = 0;
	visitor.usefunc = count_objects;
	visitor.usefunc_closure = &count;
	visitor.selfunc = select_any;
	visitor.selfunc_closure = NULL;
	apply_visitor_to_equipped(p, &visitor);
	visitor.selfunc = select_nonequipped_wearable;
	visitor.selfunc_closure = p;
	apply_visitor_to_pile(p->gear, &visitor);
	if (cave) {
		visitor.selfunc = select_seen_wearable;
		visitor.selfunc_closure = p;
		apply_visitor_to_pile(square_object(cave, p->grid), &visitor);
	}
	visitor.selfunc = select_wearable;
	visitor.selfunc_closure = NULL;
	if (store_home(p)) {
		apply_visitor_to_pile(store_home(p)->stock, &visitor);
	}

	/* Allocate storage and add the available items. */
	if (count > (*s)->nalloc) {
		mem_free((*s)->sorted_indices);
		cleanup_summary_items(*s);
		mem_free((*s)->items);
		(*s)->items = mem_zalloc(count * sizeof(*(*s)->items));
		(*s)->sorted_indices =
			mem_alloc((count + 1) * sizeof(*(*s)->sorted_indices));
		(*s)->nalloc = count;
	}
	(*s)->nitems = 0;
	visitor.usefunc = add_obj_to_summary;
	visitor.usefunc_closure = &add_obj_data;
	add_obj_data.p = p;
	add_obj_data.summary = *s;
	add_obj_data.src = EQUIP_SOURCE_WORN;
	visitor.selfunc = select_any;
	visitor.selfunc_closure = NULL;
	apply_visitor_to_equipped(p, &visitor);
	add_obj_data.src = EQUIP_SOURCE_PACK;
	visitor.selfunc = select_nonequipped_wearable;
	visitor.selfunc_closure = p;
	apply_visitor_to_pile(p->gear, &visitor);
	if (cave) {
		add_obj_data.src = EQUIP_SOURCE_FLOOR;
		visitor.selfunc = select_seen_wearable;
		visitor.selfunc_closure = p;
		apply_visitor_to_pile(square_object(cave, p->grid), &visitor);
	}
	add_obj_data.src = EQUIP_SOURCE_HOME;
	visitor.selfunc = select_wearable;
	visitor.selfunc_closure = NULL;
	if (store_home(p)) {
		apply_visitor_to_pile(store_home(p)->stock, &visitor);
	}

	compute_player_and_equipment_values(p, *s);

	/*
	 * Do an initial filtering and sorting of the items so they're ready
	 * for display.
	 */
	filter_items(*s);
	sort_items(*s);

	/* Reset selection state. */
	(*s)->isel0 = -1;
	(*s)->isel1 = -1;
	(*s)->work_sel = -1;

	return 0;
}